

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 __thiscall GYMPlayer::SeekToFilePos(GYMPlayer *this,UINT32 pos)

{
  UINT32 UVar1;
  bool bVar2;
  UINT32 pos_local;
  GYMPlayer *this_local;
  
  this->_playState = this->_playState | 8;
  while( true ) {
    bVar2 = false;
    if (this->_filePos <= pos) {
      bVar2 = (this->_playState & 2) == 0;
    }
    if (!bVar2) break;
    DoCommand(this);
  }
  this->_playTick = this->_fileTick;
  UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_playTick);
  this->_playSmpl = UVar1;
  this->_playState = this->_playState & 0xf7;
  return '\0';
}

Assistant:

UINT8 GYMPlayer::SeekToFilePos(UINT32 pos)
{
	_playState |= PLAYSTATE_SEEK;
	while(_filePos <= pos && ! (_playState & PLAYSTATE_END))
		DoCommand();
	_playTick = _fileTick;
	_playSmpl = Tick2Sample(_playTick);
	_playState &= ~PLAYSTATE_SEEK;
	
	return 0x00;
}